

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::OP_ImportCall
              (JavascriptFunction *function,Var specifier,ScriptContext *scriptContext)

{
  ScriptEntryExitRecord *count;
  JavascriptLibrary *this;
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  ModuleID moduleId;
  FunctionBody *this_00;
  JavascriptString *pJVar6;
  DWORD_PTR DVar7;
  Utf8SourceInfo *pUVar8;
  SourceContextInfo *pSVar9;
  undefined7 extraout_var;
  undefined1 *puVar10;
  undefined4 extraout_var_00;
  ScriptContext *pSVar11;
  SourceTextModuleRecord *pSVar12;
  undefined4 *puVar13;
  size_t count_00;
  Recycler *this_01;
  char16_t *dest;
  JavascriptError *pJVar14;
  undefined4 extraout_var_01;
  Var pvVar15;
  undefined1 local_f0 [8];
  JavascriptStackWalker walker;
  ModuleRecordBase *moduleRecordBase;
  JavascriptFunction *caller;
  char16_t *string;
  
  walker.currentFrame.stackCheckCodeHeight = 0;
  this_00 = JavascriptFunction::GetFunctionBody(function);
  pJVar6 = JavascriptConversion::ToString(specifier,scriptContext);
  DVar7 = FunctionProxy::GetHostSourceContext((FunctionProxy *)this_00);
  bVar3 = ParseableFunctionInfo::IsES6ModuleCode(&this_00->super_ParseableFunctionInfo);
  if (DVar7 == 0xffffffffffffffff && !bVar3) {
    pUVar8 = Utf8SourceInfo::GetCallerUtf8SourceInfo
                       ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.
                        ptr);
    if (pUVar8 == (Utf8SourceInfo *)0x0) {
      pJVar14 = JavascriptLibrary::CreateError
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary);
      JavascriptError::SetErrorMessageProperties
                (pJVar14,-0x7fffbffb,L"Unable to locate active script or module that calls import()"
                 ,scriptContext);
      pvVar15 = SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                          (false,pJVar14,scriptContext,(SourceTextModuleRecord *)0x0,true);
      return pvVar15;
    }
    pUVar8 = Utf8SourceInfo::GetCallerUtf8SourceInfo
                       ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.
                        ptr);
    pSVar9 = Utf8SourceInfo::GetSourceContextInfo(pUVar8);
    DVar7 = pSVar9->dwHostSourceContext;
    if (DVar7 == 0xffffffffffffffff) {
      moduleRecordBase = (ModuleRecordBase *)0x0;
      JavascriptStackWalker::JavascriptStackWalker
                ((JavascriptStackWalker *)local_f0,scriptContext,true,(PVOID)0x0,false);
      JavascriptStackWalker::GetCaller
                ((JavascriptStackWalker *)local_f0,(JavascriptFunction **)&moduleRecordBase,true);
      puVar10 = &DAT_00000001;
      do {
        BVar4 = JavascriptStackWalker::GetCaller
                          ((JavascriptStackWalker *)local_f0,
                           (JavascriptFunction **)&moduleRecordBase,true);
        if (((BVar4 == 0) || (moduleRecordBase == (ModuleRecordBase *)0x0)) ||
           (BVar4 = JavascriptFunction::IsScriptFunction((JavascriptFunction *)moduleRecordBase),
           BVar4 == 0)) {
          pJVar14 = JavascriptLibrary::CreateError
                              ((scriptContext->super_ScriptContextBase).javascriptLibrary);
          JavascriptError::SetErrorMessageProperties
                    (pJVar14,-0x7fffbffb,
                     L"Unable to locate active script or module that calls import()",scriptContext);
          caller = (JavascriptFunction *)0x0;
          puVar10 = (undefined1 *)
                    SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                              (false,pJVar14,scriptContext,(SourceTextModuleRecord *)0x0,true);
          DVar7 = 0xffffffffffffffff;
          goto LAB_009a9805;
        }
        this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)moduleRecordBase);
        DVar7 = FunctionProxy::GetHostSourceContext((FunctionProxy *)this_00);
        bVar3 = ParseableFunctionInfo::IsES6ModuleCode(&this_00->super_ParseableFunctionInfo);
      } while (DVar7 == 0xffffffffffffffff && !bVar3);
      caller = (JavascriptFunction *)CONCAT71(extraout_var,1);
LAB_009a9805:
      JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_f0);
      if ((char)caller == '\0') {
        return puVar10;
      }
    }
  }
  iVar5 = (*(pJVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar6);
  string = (char16_t *)CONCAT44(extraout_var_00,iVar5);
  bVar3 = ParseableFunctionInfo::IsES6ModuleCode(&this_00->super_ParseableFunctionInfo);
  if (bVar3) {
    pSVar11 = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
    this = (pSVar11->super_ScriptContextBase).javascriptLibrary;
    moduleId = FunctionBody::GetModuleID(this_00);
    pSVar12 = JavascriptLibrary::GetModuleRecord(this,moduleId);
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_f0,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar1 = scriptContext->threadContext;
    bVar3 = pTVar1->reentrancySafeOrHandled;
    pTVar1->reentrancySafeOrHandled = true;
    AutoHandledExceptionType::AutoHandledExceptionType
              ((AutoHandledExceptionType *)&moduleRecordBase,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    iVar5 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x12])
                      (scriptContext->hostScriptContext,pSVar12,string,
                       &walker.currentFrame.stackCheckCodeHeight);
    AutoHandledExceptionType::~AutoHandledExceptionType
              ((AutoHandledExceptionType *)&moduleRecordBase);
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar1->reentrancySafeOrHandled = bVar3;
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_f0);
  }
  else {
    if (DVar7 == 0xffffffffffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x284d,
                                  "(dwReferencingSourceContext != Js::Constants::NoHostSourceContext)"
                                  ,
                                  "dwReferencingSourceContext != Js::Constants::NoHostSourceContext"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar13 = 0;
    }
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_f0,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar1 = scriptContext->threadContext;
    bVar3 = pTVar1->reentrancySafeOrHandled;
    pTVar1->reentrancySafeOrHandled = true;
    AutoHandledExceptionType::AutoHandledExceptionType
              ((AutoHandledExceptionType *)&moduleRecordBase,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    iVar5 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x13])
                      (scriptContext->hostScriptContext,DVar7,string,
                       &walker.currentFrame.stackCheckCodeHeight);
    AutoHandledExceptionType::~AutoHandledExceptionType
              ((AutoHandledExceptionType *)&moduleRecordBase);
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar1->reentrancySafeOrHandled = bVar3;
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_f0);
  }
  if (iVar5 < 0) {
    caller = (JavascriptFunction *)CONCAT44(caller._4_4_,iVar5);
    count_00 = PAL_wcslen(string);
    count = (ScriptEntryExitRecord *)(count_00 + 1);
    local_f0 = (undefined1  [8])&char16_t::typeinfo;
    walker.scriptContext = (ScriptContext *)0x0;
    walker.nativeLibraryEntry = (Entry *)anon_var_dwarf_4d342ea;
    walker.prevNativeLibraryEntry._0_4_ = 0x2859;
    walker.entryExitRecord = count;
    this_01 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_f0);
    dest = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                     ((Memory *)this_01,(Recycler *)Memory::Recycler::AllocLeaf,0,(size_t)count);
    wmemcpy_s(dest,(size_t)count,string,count_00);
    dest[count_00] = L'\0';
    pJVar14 = JavascriptLibrary::CreateURIError
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    JavascriptError::SetErrorMessageProperties(pJVar14,(HRESULT)caller,dest,scriptContext);
    bVar3 = false;
    pSVar12 = (SourceTextModuleRecord *)0x0;
  }
  else {
    pSVar12 = SourceTextModuleRecord::FromHost((void *)walker.currentFrame.stackCheckCodeHeight);
    pJVar14 = (JavascriptError *)(pSVar12->errorObject).ptr;
    if (pJVar14 == (JavascriptError *)0x0) {
      if ((pSVar12->super_ModuleRecordBase).wasEvaluated != true) {
        pvVar15 = SourceTextModuleRecord::PostProcessDynamicModuleImport(pSVar12);
        return pvVar15;
      }
      iVar5 = (*(pSVar12->super_ModuleRecordBase).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[6])(pSVar12);
      pJVar14 = (JavascriptError *)CONCAT44(extraout_var_01,iVar5);
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
  }
  pvVar15 = SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise
                      (bVar3,pJVar14,scriptContext,pSVar12,true);
  return pvVar15;
}

Assistant:

Var JavascriptOperators::OP_ImportCall(__in JavascriptFunction *function, __in Var specifier, __in ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(ImportCall);
        ModuleRecordBase *moduleRecordBase = nullptr;
        SourceTextModuleRecord *moduleRecord = nullptr;

        FunctionBody* parentFuncBody = function->GetFunctionBody();
        JavascriptString *specifierString = nullptr;

        try
        {
            specifierString = JavascriptConversion::ToString(specifier, scriptContext);
        }
        catch (const JavascriptException &err)
        {
            Var errorObject = err.GetAndClear()->GetThrownObject(scriptContext);
            AssertMsg(errorObject != nullptr, "OP_ImportCall: null error object thrown by ToString(specifier)");
            if (errorObject != nullptr)
            {
                return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, errorObject, scriptContext);
            }

            Throw::InternalError();
        }

        DWORD_PTR dwReferencingSourceContext = parentFuncBody->GetHostSourceContext();
        if (!parentFuncBody->IsES6ModuleCode() && dwReferencingSourceContext == Js::Constants::NoHostSourceContext)
        {
            // import() called from eval
            if (parentFuncBody->GetUtf8SourceInfo()->GetCallerUtf8SourceInfo() == nullptr)
            {
                JavascriptError *error = scriptContext->GetLibrary()->CreateError();
                JavascriptError::SetErrorMessageProperties(error, E_FAIL, _u("Unable to locate active script or module that calls import()"), scriptContext);
                return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext);
            }

            dwReferencingSourceContext = parentFuncBody->GetUtf8SourceInfo()->GetCallerUtf8SourceInfo()->GetSourceContextInfo()->dwHostSourceContext;

            if (dwReferencingSourceContext == Js::Constants::NoHostSourceContext)
            {
                // Walk the call stack if caller function is neither module code nor having host source context

                JavascriptFunction* caller = nullptr;
                Js::JavascriptStackWalker walker(scriptContext);
                walker.GetCaller(&caller);

                do
                {
                    if (walker.GetCaller(&caller) && caller != nullptr && caller->IsScriptFunction())
                    {
                        parentFuncBody = caller->GetFunctionBody();
                        dwReferencingSourceContext = parentFuncBody->GetHostSourceContext();
                    }
                    else
                    {
                        JavascriptError *error = scriptContext->GetLibrary()->CreateError();
                        JavascriptError::SetErrorMessageProperties(error, E_FAIL, _u("Unable to locate active script or module that calls import()"), scriptContext);
                        return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext);
                    }

                } while (!parentFuncBody->IsES6ModuleCode() && dwReferencingSourceContext == Js::Constants::NoHostSourceContext);
            }
        }

        LPCOLESTR moduleName = specifierString->GetSz();
        HRESULT hr = 0;

        if (parentFuncBody->IsES6ModuleCode())
        {
            SourceTextModuleRecord *referenceModuleRecord = parentFuncBody->GetScriptContext()->GetLibrary()->GetModuleRecord(parentFuncBody->GetModuleID());
            BEGIN_LEAVE_SCRIPT(scriptContext);
            BEGIN_TRANSLATE_TO_HRESULT(static_cast<ExceptionType>(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
            hr = scriptContext->GetHostScriptContext()->FetchImportedModule(referenceModuleRecord, moduleName, &moduleRecordBase);
            END_TRANSLATE_EXCEPTION_TO_HRESULT(hr);
            END_LEAVE_SCRIPT(scriptContext);
        }
        else
        {
            Assert(dwReferencingSourceContext != Js::Constants::NoHostSourceContext);
            BEGIN_LEAVE_SCRIPT(scriptContext);
            BEGIN_TRANSLATE_TO_HRESULT(static_cast<ExceptionType>(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));
            hr = scriptContext->GetHostScriptContext()->FetchImportedModuleFromScript(dwReferencingSourceContext, moduleName, &moduleRecordBase);
            END_TRANSLATE_EXCEPTION_TO_HRESULT(hr);
            END_LEAVE_SCRIPT(scriptContext);
        }

        if (FAILED(hr))
        {
            // We cannot just use the buffer in the specifier string - need to make a copy here.
            size_t length = wcslen(moduleName);
            char16* allocatedString = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, length + 1);
            wmemcpy_s(allocatedString, length + 1, moduleName, length);
            allocatedString[length] = _u('\0');

            Js::JavascriptError *error = scriptContext->GetLibrary()->CreateURIError();
            JavascriptError::SetErrorMessageProperties(error, hr, allocatedString, scriptContext);
            return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext);
        }

        moduleRecord = SourceTextModuleRecord::FromHost(moduleRecordBase);

        if (moduleRecord->GetErrorObject() != nullptr)
        {
            return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, moduleRecord->GetErrorObject(), scriptContext, moduleRecord);
        }
        else if (moduleRecord->WasEvaluated())
        {
            return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(true, moduleRecord->GetNamespace(), scriptContext, moduleRecord);
        }

        return moduleRecord->PostProcessDynamicModuleImport();
        JIT_HELPER_END(ImportCall);
    }